

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

UtestShell * __thiscall TestRegistry::findTestWithGroup(TestRegistry *this,SimpleString *group)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  
  pUVar3 = this->tests_;
  while( true ) {
    if (pUVar3 == (UtestShell *)0x0) {
      return (UtestShell *)0x0;
    }
    UtestShell::getGroup((UtestShell *)&stack0xffffffffffffffd0);
    bVar1 = operator==((SimpleString *)&stack0xffffffffffffffd0,group);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
    if (bVar1) break;
    iVar2 = (*pUVar3->_vptr_UtestShell[3])(pUVar3);
    pUVar3 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  return pUVar3;
}

Assistant:

UtestShell* TestRegistry::findTestWithGroup(const SimpleString& group)
{
    UtestShell* current = tests_;
    while (current) {
        if (current->getGroup() == group)
            return current;
        current = current->getNext();
    }
    return NULLPTR;
}